

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void gc_mark_expression(pExecutor exec,Expr expr)

{
  anon_union_8_8_707b72ea_for_Expr_1 func;
  ValueType VVar1;
  
  func = expr.field_1;
  VVar1 = expr.type;
  if (VVar1 == VT_PAIR) {
    gc_mark_pair(exec,func.val_atom);
    return;
  }
  if (VVar1 == VT_ATOM) {
    exec->atomsFlags[func.val_atom] = exec->atomsFlags[func.val_atom] | GC_REFERENCED;
    return;
  }
  if ((char)expr.type < '\0') {
    gc_mark_pointer(exec,func.val_ptr);
    return;
  }
  if (VVar1 == VT_FUNC_VAL) {
    gc_mark_function(exec,func.val_func);
    return;
  }
  return;
}

Assistant:

void gc_mark_expression(pExecutor exec, Expr expr)
{
    if (expr.type == VT_ATOM)
        gc_mark_atom(exec, expr.val_atom);
    else if (expr.type == VT_PAIR)
        gc_mark_pair(exec, expr.val_pair);
    else if (expr.type & VT_POINTER)
        gc_mark_pointer(exec, expr.val_ptr);
    else if (expr.type == VT_FUNC_VAL)
        gc_mark_function(exec, expr.val_func);
}